

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::CreateCacheIdToPropertyIdMap(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  int **ppiVar3;
  undefined4 *puVar4;
  void ***pppvVar5;
  Recycler *pRVar6;
  int *ptr;
  uint local_54;
  uint i;
  TrackAllocData local_40;
  uint local_14;
  FunctionBody *pFStack_10;
  uint count;
  FunctionBody *this_local;
  
  pFStack_10 = this;
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__
                      ((WriteBarrierPtr *)&this->cacheIdToPropertyIdMap);
  if (*ppiVar3 != (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1090,"(this->cacheIdToPropertyIdMap == nullptr)",
                                "this->cacheIdToPropertyIdMap == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void___
                       ((WriteBarrierPtr *)&this->inlineCaches);
  if (*pppvVar5 != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1091,"(this->inlineCaches == nullptr)",
                                "this->inlineCaches == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_14 = GetInlineCacheCount(this);
  if (local_14 != 0) {
    pRVar6 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&int::typeinfo,0,(ulong)local_14,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1096);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_40);
    ptr = Memory::AllocateArray<Memory::Recycler,int,false>
                    ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)local_14);
    Memory::WriteBarrierPtr<int>::operator=(&this->cacheIdToPropertyIdMap,ptr);
    for (local_54 = 0; local_54 < local_14; local_54 = local_54 + 1) {
      ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__
                          ((WriteBarrierPtr *)&this->cacheIdToPropertyIdMap);
      (*ppiVar3)[local_54] = -1;
    }
  }
  return;
}

Assistant:

void FunctionBody::CreateCacheIdToPropertyIdMap()
    {
        Assert(this->cacheIdToPropertyIdMap == nullptr);
        Assert(this->inlineCaches == nullptr);
        uint count = this->GetInlineCacheCount() ;
        if (count!= 0)
        {
            this->cacheIdToPropertyIdMap =
                RecyclerNewArrayLeaf(this->m_scriptContext->GetRecycler(), PropertyId, count);
#if DBG
            for (uint i = 0; i < count; i++)
            {
                this->cacheIdToPropertyIdMap[i] = Js::Constants::NoProperty;
            }
#endif
        }

    }